

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O0

void __thiscall YAML::Node::EnsureNodeExists(Node *this)

{
  undefined8 uVar1;
  node *this_00;
  node *pnVar2;
  __shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  string *in_stack_00000028;
  memory_holder *in_stack_ffffffffffffffd8;
  
  if (((ulong)(((shared_memory *)&in_RDI->_M_ptr)->
              super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>)._M_ptr & 1) == 0
     ) {
    uVar1 = __cxa_allocate_exception(0x40);
    InvalidNode::InvalidNode((InvalidNode *)this,in_stack_00000028);
    __cxa_throw(uVar1,&InvalidNode::typeinfo,InvalidNode::~InvalidNode);
  }
  if (in_RDI[3]._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this_00 = (node *)operator_new(0x10);
    detail::memory_holder::memory_holder((memory_holder *)in_RDI);
    std::__shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>::
    reset<YAML::detail::memory_holder>(in_RDI,in_stack_ffffffffffffffd8);
    std::__shared_ptr_access<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x9dd823);
    pnVar2 = detail::memory_holder::create_node((memory_holder *)0x9dd82b);
    in_RDI[3]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pnVar2;
    detail::node::set_null(this_00);
  }
  return;
}

Assistant:

inline void Node::EnsureNodeExists() const {
  if (!m_isValid)
    throw InvalidNode(m_invalidKey);
  if (!m_pNode) {
    m_pMemory.reset(new detail::memory_holder);
    m_pNode = &m_pMemory->create_node();
    m_pNode->set_null();
  }
}